

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O1

void __thiscall
curlpp::FormParts::Content::Content(Content *this,char *name,char *content,char *contentType)

{
  allocator local_23;
  allocator local_22;
  allocator local_21;
  
  (this->super_FormPart)._vptr_FormPart = (_func_int **)&PTR__FormPart_00133b70;
  std::__cxx11::string::string((string *)&(this->super_FormPart).mName,name,&local_21);
  (this->super_FormPart)._vptr_FormPart = (_func_int **)&PTR__Content_00133bd0;
  std::__cxx11::string::string((string *)&this->mContent,content,&local_22);
  std::__cxx11::string::string((string *)&this->mContentType,contentType,&local_23);
  return;
}

Assistant:

curlpp::FormParts::Content::Content(const char * name, 
				    const char * content, const char * contentType)
  : FormPart(name)
  , mContent(content)
  , mContentType(contentType)
{}